

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O1

void __thiscall
TRM::TinyRender::triangle(TinyRender *this,Vec2i *a,Vec2i *b,Vec2i *c,TGAColor *color)

{
  int iVar1;
  vec<2,_float,_(glm::qualifier)0> A;
  vec<2,_float,_(glm::qualifier)0> B;
  vec<2,_float,_(glm::qualifier)0> C;
  vec<2,_float,_(glm::qualifier)0> P;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  Vec3f VVar14;
  Vec2i pts [3];
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_68 [2];
  Vec2i local_60;
  Vec2i local_58;
  undefined1 local_48 [16];
  
  local_68 = a->field_0;
  local_60 = *b;
  local_58 = *c;
  iVar3 = TGAImage::get_width(this->mImage);
  iVar3 = iVar3 + -1;
  iVar4 = TGAImage::get_height(this->mImage);
  iVar4 = iVar4 + -1;
  iVar5 = TGAImage::get_width(this->mImage);
  iVar6 = TGAImage::get_height(this->mImage);
  iVar11 = 0;
  iVar12 = 0;
  lVar7 = 0;
  do {
    iVar8 = 1;
    do {
      bVar13 = iVar8 == 0;
      iVar9 = iVar3;
      if (bVar13) {
        iVar9 = iVar4;
      }
      iVar2 = iVar5;
      if (bVar13) {
        iVar2 = iVar6;
      }
      iVar1 = local_68[lVar7 * 2 + (ulong)bVar13].x;
      iVar10 = iVar11;
      if (bVar13) {
        iVar10 = iVar12;
      }
      if (iVar1 < iVar9) {
        iVar9 = iVar1;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      if (iVar10 < iVar1) {
        iVar10 = iVar1;
      }
      if (iVar2 + -1 <= iVar10) {
        iVar10 = iVar2 + -1;
      }
      bVar13 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      iVar2 = iVar10;
      if (bVar13) {
        iVar4 = iVar9;
        iVar9 = iVar3;
        iVar2 = iVar11;
        iVar12 = iVar10;
      }
      iVar11 = iVar2;
      iVar3 = iVar9;
    } while (iVar8 == 0);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (iVar3 <= iVar11) {
    do {
      if (iVar4 <= iVar12) {
        local_48 = ZEXT416((uint)(float)iVar3);
        iVar5 = iVar4;
        do {
          A.field_1.y = (float)(a->field_1).y;
          A.field_0.x = (float)(a->field_0).x;
          B.field_1.y = (float)(b->field_1).y;
          B.field_0.x = (float)(b->field_0).x;
          C.field_1.y = (float)(c->field_1).y;
          C.field_0.x = (float)(c->field_0).x;
          P.field_1.y = (float)iVar5;
          P.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)local_48._0_4_
          ;
          VVar14 = barycentric<2ul>(A,B,C,P);
          if (((0.0 <= VVar14.field_0.x) && (0.0 <= VVar14.field_1.y)) && (0.0 <= VVar14.field_2.z))
          {
            TGAImage::set(this->mImage,iVar3,iVar5,color);
          }
          iVar5 = iVar5 + 1;
        } while (iVar12 + 1 != iVar5);
      }
      bVar13 = iVar3 != iVar11;
      iVar3 = iVar3 + 1;
    } while (bVar13);
  }
  return;
}

Assistant:

void TinyRender::triangle(const Vec2i& a, const Vec2i& b, const Vec2i& c,
                          const TGAColor& color) {
  Vec2i pts[] = {a, b, c};

  Vec2i bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec2i p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<2>(a, b, c, p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      mImage->set(p[0], p[1], color);
    }
  }
}